

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

void __thiscall duckdb_re2::Regexp::Swap(Regexp *this,Regexp *that)

{
  string *psVar1;
  string *psVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 aVar3;
  Regexp *pRVar4;
  anon_struct_8_2_38aa0e4f_for_repeat aVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 aVar6;
  Regexp *pRVar7;
  anon_struct_8_2_38aa0e4f_for_repeat aVar8;
  uint8_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  char tmp [40];
  
  psVar1 = (this->arguments).capture.name_;
  uVar13 = this->op_;
  uVar14 = this->simple_;
  uVar15 = this->parse_flags_;
  uVar16 = this->ref_;
  uVar17 = this->nsub_;
  aVar3 = this->field_5;
  pRVar4 = this->down_;
  aVar5 = (this->arguments).repeat;
  psVar2 = (that->arguments).capture.name_;
  uVar9 = that->simple_;
  uVar10 = that->parse_flags_;
  uVar11 = that->ref_;
  uVar12 = that->nsub_;
  aVar6 = that->field_5;
  pRVar7 = that->down_;
  aVar8 = (that->arguments).repeat;
  this->op_ = that->op_;
  this->simple_ = uVar9;
  this->parse_flags_ = uVar10;
  this->ref_ = uVar11;
  this->nsub_ = uVar12;
  this->field_5 = aVar6;
  this->down_ = pRVar7;
  (this->arguments).repeat = aVar8;
  (this->arguments).capture.name_ = psVar2;
  (that->arguments).capture.name_ = psVar1;
  that->down_ = pRVar4;
  (that->arguments).repeat = aVar5;
  that->op_ = uVar13;
  that->simple_ = uVar14;
  that->parse_flags_ = uVar15;
  that->ref_ = uVar16;
  that->nsub_ = uVar17;
  that->field_5 = aVar3;
  return;
}

Assistant:

void Regexp::Swap(Regexp* that) {
  // Regexp is not trivially copyable, so we cannot freely copy it with
  // memmove(3), but swapping objects like so is safe for our purposes.
  char tmp[sizeof *this];
  void* vthis = reinterpret_cast<void*>(this);
  void* vthat = reinterpret_cast<void*>(that);
  memmove(tmp, vthis, sizeof *this);
  memmove(vthis, vthat, sizeof *this);
  memmove(vthat, tmp, sizeof *this);
}